

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_dir.cpp
# Opt level: O0

bool IsCpmDirSector(Sector *sector)

{
  bool bVar1;
  int iVar2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this;
  uchar *pb_;
  int local_24;
  int u;
  uchar *pb;
  Sector *sector_local;
  
  iVar2 = Sector::data_size(sector);
  if (iVar2 < 0x200) {
    sector_local._7_1_ = false;
  }
  else {
    this = &Sector::data_copy(sector,0)->super_vector<unsigned_char,_std::allocator<unsigned_char>_>
    ;
    pb_ = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(this);
    if (((sector->header).sector == 1) && (bVar1 = IsCpmDpb(pb_), bVar1)) {
      sector_local._7_1_ = true;
    }
    else if (((sector->header).sector & 0x40U) == 0x40) {
      sector_local._7_1_ = true;
    }
    else if (((sector->header).sector & 0xc0U) == 0xc0) {
      for (local_24 = 0; local_24 < 0x200; local_24 = local_24 + 0x20) {
        bVar1 = IsCpmDirEntry(pb_ + local_24);
        if (!bVar1) {
          return false;
        }
      }
      sector_local._7_1_ = true;
    }
    else {
      sector_local._7_1_ = false;
    }
  }
  return sector_local._7_1_;
}

Assistant:

bool IsCpmDirSector(const Sector& sector)
{
    if (sector.data_size() < SECTOR_SIZE)
        return false;

    auto pb = sector.data_copy().data();

    if (sector.header.sector == 1 && IsCpmDpb(pb))
        return true;
    else if ((sector.header.sector & 0x40) == 0x40)
        return true;    // uReserved = 2, nDirBlocks = 4;
    else if ((sector.header.sector & 0xc0) != 0xc0)
        return false;

    // Check all the directory entries in the sector
    for (auto u = 0; u < SECTOR_SIZE; u += sizeof(CPM_DIR))
    {
        if (!IsCpmDirEntry(pb + u))
            return false;
    }

    return true;
}